

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseCompressedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  byte bVar1;
  UINT8 subtype;
  TreeModel *pTVar2;
  bool bVar3;
  uint uVar4;
  UINT32 UVar5;
  uint uVar6;
  UINT8 *ffsSize;
  char *pcVar7;
  UByteArray local_1e0;
  ulong local_1c0;
  COMPRESSED_SECTION_PARSING_DATA pdata_1;
  CBString local_190;
  UModelIndex local_178;
  undefined1 local_160 [8];
  CBString info;
  CBString local_130;
  undefined1 local_118 [8];
  CBString name;
  UByteArray body;
  UByteArray header;
  EFI_COMPRESSION_SECTION *compressedSectionHeader_1;
  EFI_COMPRESSION_SECTION *compressedSectionHeader;
  EFI_COMMON_SECTION_HEADER2 *section2Header;
  EFI_COMMON_SECTION_HEADER *sectionHeader;
  UINT32 uncompressedLength;
  UINT8 compressionType;
  UINT32 headerSize;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  UModelIndex parentVolumeIndex;
  UINT8 ffsVersion;
  bool insertIntoTree_local;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *section_local;
  FfsParser *this_local;
  
  uVar4 = UByteArray::size(section);
  if (uVar4 < 4) {
    this_local = (FfsParser *)0x14;
  }
  else {
    parentVolumeIndex.m._6_1_ = '\x02';
    TreeModel::findParentOfType((UModelIndex *)((long)&data.d.field_2 + 8),this->model,parent,'A');
    bVar3 = UModelIndex::isValid((UModelIndex *)((long)&data.d.field_2 + 8));
    if ((bVar3) &&
       (bVar3 = TreeModel::hasEmptyParsingData
                          (this->model,(UModelIndex *)((long)&data.d.field_2 + 8)), !bVar3)) {
      TreeModel::parsingData
                ((UByteArray *)&pdata,this->model,(UModelIndex *)((long)&data.d.field_2 + 8));
      pcVar7 = UByteArray::constData((UByteArray *)&pdata);
      parentVolumeIndex.m._6_1_ = pcVar7[0x19];
      UByteArray::~UByteArray((UByteArray *)&pdata);
    }
    ffsSize = (UINT8 *)UByteArray::constData(section);
    pcVar7 = UByteArray::constData(section);
    if ((parentVolumeIndex.m._6_1_ == '\x03') &&
       (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff)) {
      uVar4 = UByteArray::size(section);
      if (uVar4 < 0xd) {
        return 0x14;
      }
      uncompressedLength = 0xd;
      sectionHeader._7_1_ = pcVar7[0xc];
      sectionHeader._0_4_ = *(undefined4 *)(pcVar7 + 8);
    }
    else {
      uncompressedLength = 9;
      sectionHeader._7_1_ = ffsSize[8];
      sectionHeader._0_4_ = *(undefined4 *)(ffsSize + 4);
    }
    uVar4 = UByteArray::size(section);
    if (uVar4 < uncompressedLength) {
      this_local = (FfsParser *)0x14;
    }
    else {
      UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),section,uncompressedLength);
      UByteArray::mid((UByteArray *)&name.super_tagbstring.data,section,uncompressedLength,-1);
      sectionTypeToUString(&local_130,ffsSize[3]);
      Bstrlib::CBString::CBString((CBString *)&info.super_tagbstring.data," section");
      Bstrlib::CBString::operator+
                ((CBString *)local_118,&local_130,(CBString *)&info.super_tagbstring.data);
      Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
      Bstrlib::CBString::~CBString(&local_130);
      bVar1 = ffsSize[3];
      uVar4 = UByteArray::size(section);
      uVar6 = UByteArray::size(section);
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      usprintf((CBString *)local_160,
               "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)"
               ,(ulong)bVar1,(ulong)uVar4,(ulong)uVar6,(ulong)uncompressedLength);
      if (insertIntoTree) {
        pTVar2 = this->model;
        subtype = ffsSize[3];
        Bstrlib::CBString::CBString(&local_190);
        UByteArray::UByteArray((UByteArray *)&pdata_1.dictionarySize);
        TreeModel::addItem(&local_178,pTVar2,localOffset,'C',subtype,(CBString *)local_118,
                           &local_190,(CBString *)local_160,
                           (UByteArray *)((long)&body.d.field_2 + 8),
                           (UByteArray *)&name.super_tagbstring.data,
                           (UByteArray *)&pdata_1.dictionarySize,Movable,parent,'\0');
        index->m = local_178.m;
        index->r = local_178.r;
        index->c = local_178.c;
        index->i = local_178.i;
        UByteArray::~UByteArray((UByteArray *)&pdata_1.dictionarySize);
        Bstrlib::CBString::~CBString(&local_190);
        pdata_1.uncompressedSize = 0;
        local_1c0 = (ulong)CONCAT14(sectionHeader._7_1_,sectionHeader._0_4_);
        pTVar2 = this->model;
        UByteArray::UByteArray(&local_1e0,(char *)&local_1c0,0xc);
        TreeModel::setParsingData(pTVar2,index,&local_1e0);
        UByteArray::~UByteArray(&local_1e0);
      }
      this_local = (FfsParser *)0x0;
      Bstrlib::CBString::~CBString((CBString *)local_160);
      Bstrlib::CBString::~CBString((CBString *)local_118);
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
    }
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseCompressedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT8 compressionType;
    UINT32 uncompressedLength;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    else { // Normal section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize) {
        return U_INVALID_SECTION;
    }
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(sectionHeader->Type) + UString(" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)",
                            sectionHeader->Type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            headerSize, headerSize,
                            (UINT32)body.size(), (UINT32)body.size(),
                            compressionType,
                            uncompressedLength, uncompressedLength);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set section parsing data
        COMPRESSED_SECTION_PARSING_DATA pdata = {};
        pdata.compressionType = compressionType;
        pdata.uncompressedSize = uncompressedLength;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
    }
    
    return U_SUCCESS;
}